

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

char * IDAGetLinReturnFlagName(long flag)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  pcVar1 = (char *)malloc(0x1e);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1 + 6,"SUCCESS",8);
    uVar2 = 0x55535f534c414449;
    goto LAB_00113a70;
  default:
    builtin_strncpy(pcVar1,"NONE",5);
    break;
  case -9:
    builtin_strncpy(pcVar1,"IDALS_SUNLS_FAIL",0x11);
    break;
  case -8:
    builtin_strncpy(pcVar1,"IDALS_SUNMAT_FAIL",0x12);
    break;
  case -7:
    builtin_strncpy(pcVar1,"IDALS_JACFUNC_RECVR",0x14);
    break;
  case -6:
    builtin_strncpy(pcVar1,"IDALS_JACFUNC_UNRECVR",0x16);
    break;
  case -5:
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = '_';
    uVar3._2_1_ = 'P';
    uVar3._3_1_ = 'M';
    uVar4._0_1_ = 'E';
    uVar4._1_1_ = 'M';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'N';
    uVar5._0_1_ = 'U';
    uVar5._1_1_ = 'L';
    uVar5._2_1_ = 'L';
    uVar5._3_1_ = '\0';
    goto LAB_00113a47;
  case -4:
    uVar2 = 0x4c4941465f4d45;
    goto LAB_00113a62;
  case -3:
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = '_';
    uVar3._2_1_ = 'I';
    uVar3._3_1_ = 'L';
    uVar4._0_1_ = 'L';
    uVar4._1_1_ = '_';
    uVar4._2_1_ = 'I';
    uVar4._3_1_ = 'N';
    uVar5._0_1_ = 'P';
    uVar5._1_1_ = 'U';
    uVar5._2_1_ = 'T';
    uVar5._3_1_ = '\0';
    goto LAB_00113a47;
  case -2:
    uVar3._0_1_ = 'S';
    uVar3._1_1_ = '_';
    uVar3._2_1_ = 'L';
    uVar3._3_1_ = 'M';
    uVar4._0_1_ = 'E';
    uVar4._1_1_ = 'M';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'N';
    uVar5._0_1_ = 'U';
    uVar5._1_1_ = 'L';
    uVar5._2_1_ = 'L';
    uVar5._3_1_ = '\0';
LAB_00113a47:
    pcVar1[0] = 'I';
    pcVar1[1] = 'D';
    pcVar1[2] = 'A';
    pcVar1[3] = 'L';
    *(undefined4 *)(pcVar1 + 4) = uVar3;
    *(undefined4 *)(pcVar1 + 8) = uVar4;
    *(undefined4 *)(pcVar1 + 0xc) = uVar5;
    break;
  case -1:
    uVar2 = 0x4c4c554e5f4d45;
LAB_00113a62:
    *(undefined8 *)(pcVar1 + 7) = uVar2;
    uVar2 = 0x454d5f534c414449;
LAB_00113a70:
    *(undefined8 *)pcVar1 = uVar2;
  }
  return pcVar1;
}

Assistant:

char* IDAGetLinReturnFlagName(long int flag)
{
  char* name = (char*)malloc(30 * sizeof(char));

  switch (flag)
  {
  case IDALS_SUCCESS: sprintf(name, "IDALS_SUCCESS"); break;
  case IDALS_MEM_NULL: sprintf(name, "IDALS_MEM_NULL"); break;
  case IDALS_LMEM_NULL: sprintf(name, "IDALS_LMEM_NULL"); break;
  case IDALS_ILL_INPUT: sprintf(name, "IDALS_ILL_INPUT"); break;
  case IDALS_MEM_FAIL: sprintf(name, "IDALS_MEM_FAIL"); break;
  case IDALS_PMEM_NULL: sprintf(name, "IDALS_PMEM_NULL"); break;
  case IDALS_JACFUNC_UNRECVR: sprintf(name, "IDALS_JACFUNC_UNRECVR"); break;
  case IDALS_JACFUNC_RECVR: sprintf(name, "IDALS_JACFUNC_RECVR"); break;
  case IDALS_SUNMAT_FAIL: sprintf(name, "IDALS_SUNMAT_FAIL"); break;
  case IDALS_SUNLS_FAIL: sprintf(name, "IDALS_SUNLS_FAIL"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}